

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O0

void showBasketList(Farm *farm)

{
  double dVar1;
  bool bVar2;
  ostream *poVar3;
  reference pBVar4;
  allocator local_d9;
  string local_d8 [32];
  undefined1 auStack_b8 [8];
  Basket b;
  iterator __end2;
  iterator __begin2;
  vector<Basket,_std::allocator<Basket>_> *__range2;
  undefined1 local_80 [8];
  vector<Basket,_std::allocator<Basket>_> baskets;
  pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_> *cb_pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
  *__range1;
  Farm *farm_local;
  
  line(0x14,'-');
  poVar3 = std::operator<<((ostream *)&std::cout,"Baskets");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  line(0x14,'-');
  Farm::getBaskets((unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
                    *)&__begin1,farm);
  __end1 = std::
           unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
           ::begin((unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
                    *)&__begin1);
  cb_pair = (pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_> *)
            std::
            unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
            ::end((unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
                   *)&__begin1);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                         *)&cb_pair);
    if (!bVar2) break;
    baskets.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::__detail::
                  _Node_iterator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false,_false>
                  ::operator*(&__end1);
    std::vector<Basket,_std::allocator<Basket>_>::vector
              ((vector<Basket,_std::allocator<Basket>_> *)local_80,
               &((reference)
                baskets.super__Vector_base<Basket,_std::allocator<Basket>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)->second);
    __end2 = std::vector<Basket,_std::allocator<Basket>_>::begin
                       ((vector<Basket,_std::allocator<Basket>_> *)local_80);
    b._8_8_ = std::vector<Basket,_std::allocator<Basket>_>::end
                        ((vector<Basket,_std::allocator<Basket>_> *)local_80);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Basket_*,_std::vector<Basket,_std::allocator<Basket>_>_>
                                  *)&b.client_nif);
      if (!bVar2) break;
      pBVar4 = __gnu_cxx::__normal_iterator<Basket_*,_std::vector<Basket,_std::allocator<Basket>_>_>
               ::operator*(&__end2);
      auStack_b8 = (undefined1  [8])pBVar4->weight;
      b.weight = *(double *)&pBVar4->client_nif;
      poVar3 = std::operator<<((ostream *)&std::cout,"Client\'s NIF: ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*(int *)&(baskets.
                                           super__Vector_base<Basket,_std::allocator<Basket>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          weight);
      poVar3 = std::operator<<(poVar3," | Weight: ");
      dVar1 = Basket::getWeight((Basket *)auStack_b8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::__normal_iterator<Basket_*,_std::vector<Basket,_std::allocator<Basket>_>_>::
      operator++(&__end2);
    }
    std::vector<Basket,_std::allocator<Basket>_>::~vector
              ((vector<Basket,_std::allocator<Basket>_> *)local_80);
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  std::
  unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
  ::~unordered_map((unordered_map<int,_std::vector<Basket,_std::allocator<Basket>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>_>
                    *)&__begin1);
  line(0x14,'-');
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"ENTER to go back",&local_d9);
  enterWait((string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  return;
}

Assistant:

void showBasketList(Farm &farm){
    line(20);
    cout << "Baskets" << endl;
    line(20);
    for (const auto& cb_pair : farm.getBaskets()) {
        vector<Basket> baskets = cb_pair.second;
        for (Basket b: baskets){
            cout << "Client's NIF: " << cb_pair.first << " | Weight: " << b.getWeight() << endl;
        }
    }
    line(20);
    enterWait();
}